

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O1

int nghttp2_bufs_orb_hold(nghttp2_bufs *bufs,uint8_t b)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((bufs->cur->buf).end == (bufs->cur->buf).last) {
    iVar2 = bufs_alloc_chain(bufs);
  }
  if (iVar2 == 0) {
    pbVar1 = (bufs->cur->buf).last;
    *pbVar1 = *pbVar1 | b;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_bufs_orb_hold(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

  *bufs->cur->buf.last |= b;

  return 0;
}